

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RandomBernoulliDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randombernoullidynamic
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x4c4) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4c4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.randombernoullidynamic_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::RandomBernoulliDynamicLayerParams>(arena);
    (this->layer_).randombernoullidynamic_ = (RandomBernoulliDynamicLayerParams *)LVar2;
  }
  return (RandomBernoulliDynamicLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliDynamicLayerParams* NeuralNetworkLayer::_internal_mutable_randombernoullidynamic() {
  if (!_internal_has_randombernoullidynamic()) {
    clear_layer();
    set_has_randombernoullidynamic();
    layer_.randombernoullidynamic_ = CreateMaybeMessage< ::CoreML::Specification::RandomBernoulliDynamicLayerParams >(GetArenaForAllocation());
  }
  return layer_.randombernoullidynamic_;
}